

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O0

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *out,
                lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *R)

{
  long lVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  wostream *pwVar3;
  char *pcVar4;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar5;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *in_RSI;
  wostream *in_RDI;
  fmtflags flags;
  undefined4 in_stack_ffffffffffffffe8;
  
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  lVar1 = *(long *)(*(long *)in_RDI + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)(in_RDI + lVar1),_Var2);
  pwVar3 = std::operator<<(in_RDI,'[');
  pcVar4 = lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::name();
  pwVar3 = std::operator<<(pwVar3,pcVar4);
  std::operator<<(pwVar3,' ');
  pbVar5 = operator<<(in_RSI,(status_type *)CONCAT44(__fmtfl,in_stack_ffffffffffffffe8));
  std::operator<<((wostream *)pbVar5,']');
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)in_RDI;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
        std::basic_ostream<char_t, traits_t> &out, const lagfib4xor &R) {
      std::ios_base::fmtflags flags(out.flags());
      out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      out << '[' << lagfib4xor::name() << ' ' << R.S << ']';
      out.flags(flags);
      return out;
    }